

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

QString * __thiscall XmlOutput::doConversion(XmlOutput *this,QString *text)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  bool bVar1;
  char16_t cVar2;
  qsizetype qVar3;
  QString *in_RDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  QString *output;
  QChar c;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb4;
  char16_t in_stack_fffffffffffffeb6;
  QString *in_stack_fffffffffffffeb8;
  uint7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  int6 iVar4;
  QChar QVar5;
  undefined6 in_stack_fffffffffffffee8;
  QChar in_stack_fffffffffffffeee;
  int local_110;
  CaseSensitivity local_f0;
  QChar local_da;
  CaseSensitivity local_d8;
  QChar local_c2;
  CaseSensitivity local_c0;
  QChar local_aa;
  CaseSensitivity local_a8;
  QChar local_98;
  char16_t local_96;
  QLatin1Char local_93 [72];
  QLatin1Char local_4b [24];
  QLatin1Char local_33 [20];
  QLatin1Char local_1f [3];
  char16_t local_1c;
  QLatin1Char local_19 [3];
  char16_t local_16;
  QLatin1Char local_13 [3];
  char16_t local_10;
  QLatin1Char local_d [3];
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QString::size(in_RDX);
  if (qVar3 == 0) {
    QString::QString((QString *)0x2c10cc);
  }
  else if (*(int *)(in_RSI + 0x44) == 0) {
    QString::QString((QString *)
                     CONCAT26(in_stack_fffffffffffffeb6,
                              CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
                     (QString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QString::QString((QString *)0x2c1121);
    if (*(int *)(in_RSI + 0x44) == 2) {
      local_110 = 0;
      while( true ) {
        iVar4 = (int6)local_110;
        QVar5.ucs = (char16_t)(local_110 >> 0x1f);
        qVar3 = QString::size(in_RDX);
        if (qVar3 <= CONCAT26(QVar5.ucs,iVar4)) break;
        local_a.ucs = L'ꪪ';
        local_a = QString::at(in_stack_fffffffffffffeb8,
                              CONCAT26(in_stack_fffffffffffffeb6,
                                       CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                                      ));
        QLatin1Char::QLatin1Char(local_d,'&');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                     CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
        bVar1 = ::operator==((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                               CONCAT24(in_stack_fffffffffffffeb4,
                                                        in_stack_fffffffffffffeb0)),
                             (QChar *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
        ;
        if (bVar1) {
          in_stack_fffffffffffffeb8 = (QString *)(long)(local_110 + 7);
          qVar3 = QString::size(in_RDX);
          in_stack_fffffffffffffec7 = false;
          if ((long)in_stack_fffffffffffffeb8 < qVar3) {
            local_10 = (char16_t)
                       QString::at(in_stack_fffffffffffffeb8,
                                   CONCAT26(in_stack_fffffffffffffeb6,
                                            CONCAT24(in_stack_fffffffffffffeb4,
                                                     in_stack_fffffffffffffeb0)));
            QLatin1Char::QLatin1Char(local_13,'#');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                         CONCAT24(in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0)),
                       (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
            bVar1 = ::operator==((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                                   CONCAT24(in_stack_fffffffffffffeb4,
                                                            in_stack_fffffffffffffeb0)),
                                 (QChar *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8));
            in_stack_fffffffffffffec7 = false;
            if (bVar1) {
              local_16 = (char16_t)
                         QString::at(in_stack_fffffffffffffeb8,
                                     CONCAT26(in_stack_fffffffffffffeb6,
                                              CONCAT24(in_stack_fffffffffffffeb4,
                                                       in_stack_fffffffffffffeb0)));
              QLatin1Char::QLatin1Char(local_19,'x');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                           CONCAT24(in_stack_fffffffffffffeb4,
                                                    in_stack_fffffffffffffeb0)),
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
              bVar1 = ::operator==((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                                     CONCAT24(in_stack_fffffffffffffeb4,
                                                              in_stack_fffffffffffffeb0)),
                                   (QChar *)CONCAT44(in_stack_fffffffffffffeac,
                                                     in_stack_fffffffffffffea8));
              in_stack_fffffffffffffec7 = false;
              if (bVar1) {
                local_1c = (char16_t)
                           QString::at(in_stack_fffffffffffffeb8,
                                       CONCAT26(in_stack_fffffffffffffeb6,
                                                CONCAT24(in_stack_fffffffffffffeb4,
                                                         in_stack_fffffffffffffeb0)));
                QLatin1Char::QLatin1Char(local_1f,';');
                QChar::QChar<QLatin1Char,_true>
                          ((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,
                                                      in_stack_fffffffffffffeb0)),
                           (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
                in_stack_fffffffffffffec7 =
                     ::operator==((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                                    CONCAT24(in_stack_fffffffffffffeb4,
                                                             in_stack_fffffffffffffeb0)),
                                  (QChar *)CONCAT44(in_stack_fffffffffffffeac,
                                                    in_stack_fffffffffffffea8));
              }
            }
          }
          if ((bool)in_stack_fffffffffffffec7 == false) {
            QLatin1String::QLatin1String
                      ((QLatin1String *)(ulong)in_stack_fffffffffffffec0,
                       (char *)in_stack_fffffffffffffeb8);
            s.m_size._7_1_ = in_stack_fffffffffffffec7;
            s.m_size._0_7_ = in_stack_fffffffffffffec0;
            s.m_data._0_6_ = iVar4;
            s.m_data._6_2_ = QVar5.ucs;
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),s);
          }
          else {
            in_stack_fffffffffffffeee =
                 QString::at(in_stack_fffffffffffffeb8,
                             CONCAT26(in_stack_fffffffffffffeb6,
                                      CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
                            );
            QString::operator+=((QString *)
                                CONCAT26(in_stack_fffffffffffffeb6,
                                         CONCAT24(in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0)),
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
          }
        }
        else {
          QLatin1Char::QLatin1Char(local_33,'<');
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                       CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                                      ),
                     (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
          bVar1 = ::operator==((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                                 CONCAT24(in_stack_fffffffffffffeb4,
                                                          in_stack_fffffffffffffeb0)),
                               (QChar *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                ));
          if (bVar1) {
            QLatin1String::QLatin1String
                      ((QLatin1String *)
                       CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                       (char *)in_stack_fffffffffffffeb8);
            s_00.m_size._7_1_ = in_stack_fffffffffffffec7;
            s_00.m_size._0_7_ = in_stack_fffffffffffffec0;
            s_00.m_data._0_6_ = iVar4;
            s_00.m_data._6_2_ = QVar5.ucs;
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),s_00);
          }
          else {
            QLatin1Char::QLatin1Char(local_4b,'>');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                         CONCAT24(in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0)),
                       (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
            bVar1 = ::operator==((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                                   CONCAT24(in_stack_fffffffffffffeb4,
                                                            in_stack_fffffffffffffeb0)),
                                 (QChar *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8));
            if (bVar1) {
              QLatin1String::QLatin1String
                        ((QLatin1String *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                         (char *)in_stack_fffffffffffffeb8);
              s_01.m_size._7_1_ = in_stack_fffffffffffffec7;
              s_01.m_size._0_7_ = in_stack_fffffffffffffec0;
              s_01.m_data._0_6_ = iVar4;
              s_01.m_data._6_2_ = QVar5.ucs;
              QString::operator+=((QString *)
                                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),s_01
                                 );
            }
            else {
              cVar2 = QChar::unicode(&local_a);
              if ((ushort)cVar2 < 0x20) {
                QString::QString(in_stack_fffffffffffffeb8,
                                 (char *)CONCAT26(in_stack_fffffffffffffeee.ucs,
                                                  in_stack_fffffffffffffee8));
                in_stack_fffffffffffffeb6 = QChar::unicode(&local_a);
                QLatin1Char::QLatin1Char(local_93,'0');
                QChar::QChar<QLatin1Char,_true>
                          ((QChar *)CONCAT26(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,
                                                      in_stack_fffffffffffffeb0)),
                           (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
                QString::arg<unsigned_short,_true>
                          (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb6,
                           in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,QVar5);
                QString::operator+=((QString *)
                                    CONCAT26(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,
                                                      in_stack_fffffffffffffeb0)),
                                    (QString *)
                                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
                QString::~QString((QString *)0x2c1526);
                QString::~QString((QString *)0x2c1533);
              }
              else {
                local_96 = local_a.ucs;
                QString::operator+=((QString *)
                                    CONCAT26(in_stack_fffffffffffffeb6,
                                             CONCAT24(in_stack_fffffffffffffeb4,
                                                      in_stack_fffffffffffffeb0)),
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
              }
            }
          }
        }
        local_110 = local_110 + 1;
      }
    }
    else {
      QString::operator=(in_RDI,(QString *)in_RDX);
    }
    QVar5.ucs = (char16_t)in_RDI;
    if (*(int *)(in_RSI + 0x44) == 2) {
      QChar::QChar<char,_true>(&local_98,'\"');
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8);
      QString::replace(QVar5,(QLatin1String *)(ulong)(ushort)local_98.ucs,local_a8);
      QChar::QChar<char,_true>(&local_aa,'\'');
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8);
      QString::replace(QVar5,(QLatin1String *)(ulong)(ushort)local_aa.ucs,local_c0);
    }
    else if (*(int *)(in_RSI + 0x44) == 1) {
      QChar::QChar<char,_true>(&local_c2,'\"');
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8);
      QString::replace(QVar5,(QLatin1String *)(ulong)(ushort)local_c2.ucs,local_d8);
      QChar::QChar<char,_true>(&local_da,'\'');
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8);
      QString::replace(QVar5,(QLatin1String *)(ulong)(ushort)local_da.ucs,local_f0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString XmlOutput::doConversion(const QString &text)
{
    if (!text.size())
        return QString();
    else if (conversion == NoConversion)
        return text;

    QString output;
    if (conversion == XMLConversion) {

        // this is a way to escape characters that shouldn't be converted
        for (int i=0; i<text.size(); ++i) {
            const QChar c = text.at(i);
            if (c == QLatin1Char('&')) {
                if ( (i + 7) < text.size() &&
                    text.at(i + 1) == QLatin1Char('#') &&
                    text.at(i + 2) == QLatin1Char('x') &&
                    text.at(i + 7) == QLatin1Char(';') ) {
                    output += text.at(i);
                } else {
                    output += QLatin1String("&amp;");
                }
            } else if (c == QLatin1Char('<')) {
                output += QLatin1String("&lt;");
            } else if (c == QLatin1Char('>')) {
                output += QLatin1String("&gt;");
            } else {
                if (c.unicode() < 0x20) {
                    output += QString("&#x%1;").arg(ushort{c.unicode()}, 2, 16, QLatin1Char('0'));
                } else {
                    output += c;
                }
            }
        }
    } else {
        output = text;
    }

    if (conversion == XMLConversion) {
        output.replace('\"', QLatin1String("&quot;"));
        output.replace('\'', QLatin1String("&apos;"));
    } else if (conversion == EscapeConversion) {
        output.replace('\"', QLatin1String("\\\""));
        output.replace('\'', QLatin1String("\\\'"));
    }
    return output;
}